

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.cc
# Opt level: O3

void Reporter::Send(Report *report)

{
  long *plVar1;
  long in_FS_OFFSET;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_20;
  
  plVar1 = *(long **)(in_FS_OFFSET + -0x10);
  if (plVar1 != (long *)0x0) {
    local_20._M_impl._M_node.super__List_node_base._M_next =
         (report->
         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl._M_node.super__List_node_base._M_next;
    local_20._M_impl._M_node.super__List_node_base._M_prev =
         (report->
         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl._M_node.super__List_node_base._M_prev;
    local_20._M_impl._M_node._M_size =
         (report->
         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl._M_node._M_size;
    if (local_20._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)report) {
      local_20._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_20;
      local_20._M_impl._M_node.super__List_node_base._M_prev =
           local_20._M_impl._M_node.super__List_node_base._M_next;
    }
    else {
      (((_List_impl *)&(local_20._M_impl._M_node.super__List_node_base._M_prev)->_M_next)->_M_node).
      super__List_node_base._M_next = (_List_node_base *)&local_20;
      (local_20._M_impl._M_node.super__List_node_base._M_next)->_M_prev =
           (_List_node_base *)&local_20;
      (report->
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)report;
      (report->
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)report;
      (report->
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl._M_node._M_size = 0;
    }
    (**(code **)(*plVar1 + 0x10))(plVar1,&local_20);
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(&local_20);
  }
  return;
}

Assistant:

static void Send(Report report) {
    if (GetCurrent()) {
      GetCurrent()->SendReport(std::move(report));
    }
  }